

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

ConstTokenOrSyntax * __thiscall
slang::syntax::SignalEventExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,SignalEventExpressionSyntax *this,size_t index
          )

{
  Info *pIVar1;
  IffEventClauseSyntax *pIVar2;
  
  if (index == 2) {
    pIVar2 = this->iffClause;
  }
  else {
    if (index != 1) {
      if (index == 0) {
        pIVar1 = (this->edge).info;
        *(undefined8 *)
         &(__return_storage_ptr__->
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
             *(undefined8 *)&this->edge;
        *(Info **)((long)&(__return_storage_ptr__->
                          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
                          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                  + 8) = pIVar1;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->
                 super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
                 super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
         + 0x10) = '\0';
        return __return_storage_ptr__;
      }
      ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
      return __return_storage_ptr__;
    }
    pIVar2 = (IffEventClauseSyntax *)(this->expr).ptr;
  }
  *(IffEventClauseSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pIVar2;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = '\x01';
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax SignalEventExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return edge;
        case 1: return expr.get();
        case 2: return iffClause;
        default: return nullptr;
    }
}